

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O2

int scan_hexadecimal_number
              (OnigUChar **src,OnigUChar *end,int minlen,int maxlen,OnigEncoding enc,
              OnigCodePoint *rcode)

{
  OnigCodePoint OVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  OnigUChar *pOVar7;
  
  pOVar7 = *src;
  uVar6 = 0;
  for (iVar5 = 0; (pOVar7 < end && (iVar5 < maxlen)); iVar5 = iVar5 + 1) {
    OVar1 = (*enc->mbc_to_code)(pOVar7,end);
    iVar2 = (*enc->mbc_enc_len)(pOVar7);
    if ((0x7f < OVar1) || (iVar3 = (*enc->is_code_ctype)(OVar1,0xb), iVar3 == 0)) break;
    iVar4 = (*enc->is_code_ctype)(OVar1,4);
    iVar3 = -0x30;
    if (iVar4 == 0) {
      iVar3 = (*enc->is_code_ctype)(OVar1,10);
      iVar3 = (uint)(iVar3 != 0) * 0x20 + -0x57;
    }
    if (~(OVar1 + iVar3) >> 4 < uVar6) {
      return -200;
    }
    pOVar7 = pOVar7 + iVar2;
    uVar6 = uVar6 * 0x10 + OVar1 + iVar3;
  }
  iVar2 = -400;
  if (minlen <= iVar5) {
    *rcode = uVar6;
    *src = pOVar7;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
scan_hexadecimal_number(UChar** src, UChar* end, int minlen, int maxlen,
                        OnigEncoding enc, OnigCodePoint* rcode)
{
  OnigCodePoint code;
  OnigCodePoint c;
  unsigned int val;
  int n;
  UChar* p;
  PFETCH_READY;

  p = *src;
  code = 0;
  n = 0;
  while (! PEND && n < maxlen) {
    PFETCH(c);
    if (IS_CODE_XDIGIT_ASCII(enc, c)) {
      n++;
      val = (unsigned int )XDIGITVAL(enc, c);
      if ((UINT_MAX - val) / 16UL < code)
        return ONIGERR_TOO_BIG_NUMBER; /* overflow */

      code = (code << 4) + val;
    }
    else {
      PUNFETCH;
      break;
    }
  }

  if (n < minlen)
    return ONIGERR_INVALID_CODE_POINT_VALUE;

  *rcode = code;
  *src = p;
  return ONIG_NORMAL;
}